

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WhiteRoomFiveAction.cpp
# Opt level: O2

ActionResults * __thiscall WhiteRoomFiveAction::Pick(WhiteRoomFiveAction *this)

{
  itemType iVar1;
  itemLocation iVar2;
  ActionResults *this_00;
  ItemWrapper *pIVar3;
  string *this_01;
  itemType local_54;
  string local_50;
  string local_30;
  
  iVar1 = Command::getMainItem((this->super_AbstractRoomAction).commands);
  if (iVar1 == BOWL) {
    this_00 = (ActionResults *)operator_new(0x30);
    std::__cxx11::string::string
              ((string *)&local_30,"You can\'t pick it up. It\'s stuck to the table!",
               (allocator *)&local_54);
    ActionResults::ActionResults(this_00,CURRENT,&local_30);
    this_01 = &local_30;
LAB_001235ea:
    std::__cxx11::string::~string((string *)this_01);
  }
  else {
    iVar1 = Command::getMainItem((this->super_AbstractRoomAction).commands);
    if (iVar1 == PITCHER) {
      local_54 = PITCHER;
      pIVar3 = ItemTable::getValue((this->super_AbstractRoomAction).itemList,&local_54);
      iVar2 = ItemWrapper::getLocation(pIVar3);
      if (iVar2 != BACKPACK) {
        local_54 = PITCHER;
        pIVar3 = ItemTable::getValue((this->super_AbstractRoomAction).itemList,&local_54);
        ItemWrapper::setLocation(pIVar3,BACKPACK);
        this_00 = (ActionResults *)operator_new(0x30);
        std::__cxx11::string::string
                  ((string *)&local_50,
                   "Cool... you can use this at your next party. It seems to be carrying some unknown, dark liquid."
                   ,(allocator *)&local_54);
        ActionResults::ActionResults(this_00,CURRENT,&local_50);
        this_01 = &local_50;
        goto LAB_001235ea;
      }
    }
    this_00 = AbstractRoomAction::Pick(&this->super_AbstractRoomAction);
  }
  return this_00;
}

Assistant:

ActionResults *WhiteRoomFiveAction::Pick() {
    if(commands->getMainItem() == BOWL) {
        return new ActionResults(CURRENT, "You can't pick it up. It's stuck to the table!");
    }
    else if(commands->getMainItem() == PITCHER && itemList->getValue(PITCHER)->getLocation() != BACKPACK){
        itemList->getValue(PITCHER)->setLocation(BACKPACK);
        return new ActionResults(CURRENT, "Cool... you can use this at your next party. It seems to be carrying some unknown, dark liquid.");
    }
    else {
        return AbstractRoomAction::Pick();
    }
}